

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_float2 *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type sVar5;
  size_type sVar6;
  _Base_ptr __k;
  fmt fVar7;
  undefined1 uVar8;
  fmt fVar9;
  int iVar10;
  const_iterator cVar11;
  ostream *poVar12;
  undefined8 *puVar13;
  long *plVar14;
  long *plVar15;
  mapped_type *pmVar16;
  _Base_ptr p_Var17;
  Property *prop;
  ushort uVar18;
  uint uVar19;
  size_type __n;
  PrimVar *extraout_RDX;
  PrimVar *extraout_RDX_00;
  PrimVar *extraout_RDX_01;
  bool bVar20;
  ParseResult ret;
  ParseResult sret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> tok_attr;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa38;
  undefined1 local_5b8 [8];
  _Alloc_hider local_5b0;
  undefined1 local_5a8 [24];
  undefined1 local_590 [16];
  undefined1 local_580 [24];
  string local_568;
  AttrMetas *local_548;
  UsdPrimvarReader_float2 *local_540;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_538;
  string *local_530;
  long *local_528 [2];
  long local_518 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  optional<tinyusdz::Animatable<std::array<float,2ul>>> *local_4b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_4b0;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_4a8;
  string *local_4a0;
  _Base_ptr local_498;
  _Base_ptr local_490;
  undefined1 local_488 [16];
  undefined1 local_478 [96];
  ios_base local_418 [264];
  string local_310 [16];
  long local_300 [2];
  string local_2f0 [16];
  undefined8 local_2e0 [2];
  undefined1 local_2d0 [32];
  fmt local_2b0;
  undefined7 uStack_2af;
  undefined1 local_2a8 [16];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_298;
  undefined1 auStack_278 [16];
  storage_union sStack_268;
  undefined8 local_258;
  undefined1 auStack_250 [32];
  ios_base aiStack_230 [8];
  undefined1 local_228 [16];
  undefined1 local_218;
  optional<tinyusdz::Interpolation> local_210;
  optional<unsigned_int> oStack_208;
  size_t local_200;
  pointer pSStack_1f8;
  storage_t<tinyusdz::value::StringData> local_1f0;
  undefined1 local_1c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined8 uStack_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  undefined1 auStack_170 [32];
  _Alloc_hider local_150;
  undefined1 auStack_148 [32];
  size_type local_128;
  storage_t<tinyusdz::Token> sStack_120;
  pointer local_100;
  storage_t<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>_>
  sStack_f8;
  undefined1 local_c8 [48];
  undefined1 auStack_98 [24];
  storage_t<tinyusdz::Animatable<tinyusdz::Token>_> local_80 [16];
  storage_t<tinyusdz::Token> local_70;
  storage_t<double> sStack_50;
  bool bStack_48;
  undefined7 local_47;
  undefined1 uStack_40;
  undefined8 uStack_3f;
  PrimVar *var;
  
  local_508._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_508._M_impl.super__Rb_tree_header._M_header;
  local_508._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_508._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_508._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_530 = warn;
  local_508._M_impl.super__Rb_tree_header._M_header._M_right =
       local_508._M_impl.super__Rb_tree_header._M_header._M_left;
  _local_2b0 = local_2a8 + 8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b0);
  if ((undefined1 *)_local_2b0 != local_2a8 + 8) {
    operator_delete((void *)_local_2b0,
                    CONCAT17(local_2a8[0xf],
                             CONCAT16(local_2a8[0xe],
                                      CONCAT24(local_2a8._12_2_,
                                               CONCAT22(local_2a8._10_2_,local_2a8._8_2_)))) + 1);
  }
  p_Var17 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_498 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar20 = true;
  if (p_Var17 != local_498) {
    local_538 = &preader->varname;
    local_548 = &(preader->fallback)._metas;
    local_4a8 = &(preader->fallback)._paths;
    local_4b8 = (optional<tinyusdz::Animatable<std::array<float,2ul>>> *)
                &(preader->fallback)._attrib;
    local_4a0 = (string *)&preader->result;
    local_4b0 = &(preader->super_ShaderNode).super_UsdShadePrim.props;
    local_540 = preader;
    do {
      local_490 = p_Var17 + 1;
      iVar10 = ::std::__cxx11::string::compare((char *)local_490);
      if (iVar10 == 0) {
        _local_2b0 = local_2a8 + 8;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"inputs:varname","");
        cVar11 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_508,(key_type *)&local_2b0);
        if ((undefined1 *)_local_2b0 != local_2a8 + 8) {
          operator_delete((void *)_local_2b0,
                          CONCAT17(local_2a8[0xf],
                                   CONCAT16(local_2a8[0xe],
                                            CONCAT24(local_2a8._12_2_,
                                                     CONCAT22(local_2a8._10_2_,local_2a8._8_2_)))) +
                          1);
        }
        if ((_Rb_tree_header *)cVar11._M_node != &local_508._M_impl.super__Rb_tree_header)
        goto LAB_002373d5;
        _local_2b0 = ((ulong)_local_2b0 >> 8 & 0xffffff) << 8;
        local_2a8._0_8_ = ((ulong)local_2a8._0_8_ >> 8 & 0xffffff) << 8;
        local_2a8._8_2_ = 0;
        local_298.data._0_8_ = (undefined8)((ulong)local_298.data._0_8_ & 0xffffffffffffff00);
        local_228._8_8_ = (pointer)0x0;
        local_218 = 0;
        local_100 = (pointer)0x0;
        sStack_f8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        sStack_120._16_8_ = 0;
        sStack_120._24_8_ = 0;
        sStack_f8._16_4_ = 0;
        sStack_f8._24_8_ = 0;
        sStack_268._8_1_ = 0;
        auStack_278._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        sStack_268.dynamic = (void *)0x0;
        local_298._24_8_ = 0;
        auStack_278._0_8_ = 0;
        local_298._8_4_ = Varying;
        local_298._12_1_ = false;
        local_298._13_3_ = 0;
        local_298._16_8_ = (pointer)0x0;
        local_228[0] = 0;
        auStack_250._24_8_ = (pointer)0x0;
        aiStack_230[0] = (ios_base)0x0;
        aiStack_230[1] = (ios_base)0x0;
        aiStack_230[2] = (ios_base)0x0;
        aiStack_230[3] = (ios_base)0x0;
        aiStack_230[4] = (ios_base)0x0;
        aiStack_230[5] = (ios_base)0x0;
        aiStack_230[6] = (ios_base)0x0;
        aiStack_230[7] = (ios_base)0x0;
        auStack_250._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_250._16_8_ = (pointer)0x0;
        local_258 = (vtable_type *)0x0;
        auStack_250._0_8_ = 0;
        local_1f0._0_1_ = 0;
        local_200 = 0;
        pSStack_1f8 = (pointer)0x0;
        local_210.has_value_ = false;
        local_210._1_3_ = 0;
        local_210.contained = (storage_t<tinyusdz::Interpolation>)0x0;
        oStack_208.has_value_ = false;
        oStack_208._1_3_ = 0;
        oStack_208.contained = (storage_t<unsigned_int>)0x0;
        local_1f0._40_1_ = 0;
        local_1f0._24_8_ = 0;
        local_1f0._32_8_ = 0;
        local_1f0._8_8_ = 0;
        local_1f0._16_8_ = 0;
        local_1a0._M_local_buf[0] = '\0';
        local_1c0._16_8_ = 0;
        local_1c0._24_8_ = 0;
        local_1c0._0_8_ = 0;
        local_1c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_170[8] = 0;
        aStack_180._8_8_ = 0;
        auStack_170._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        local_188 = 0;
        aStack_180._M_allocated_capacity = 0;
        local_1a0._8_8_ = 0;
        uStack_190 = 0;
        auStack_148[8] = '\0';
        local_150._M_p = (pointer)0x0;
        auStack_148._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_170._16_8_ = 0;
        auStack_170._24_8_ = 0;
        sStack_120._8_1_ = 0;
        local_128 = 0;
        sStack_120.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_148._16_8_ = 0;
        auStack_148._24_8_ = 0;
        sStack_f8._32_8_ = (long)&sStack_f8 + 0x10;
        local_c8[0x20] = 0;
        local_c8._16_8_ = 0;
        local_c8._24_8_ = 0;
        local_c8._0_8_ = 0;
        local_c8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
        auStack_98[8] = 0;
        auStack_98._9_8_ = 0;
        local_c8._40_8_ = 0;
        auStack_98[0] = 0;
        auStack_98._1_7_ = 0;
        uStack_40 = 0;
        uStack_3f = 0;
        sStack_50 = (storage_t<double>)0x0;
        bStack_48 = false;
        local_47 = 0;
        local_70._16_8_ = 0;
        local_70._24_8_ = 0;
        local_70.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_70._8_8_ = 0;
        local_80[0] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[1] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[2] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[3] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[4] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[5] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[6] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[7] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[8] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[9] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[10] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[0xb] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[0xc] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[0xd] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[0xe] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_80[0xf] = (storage_t<tinyusdz::Animatable<tinyusdz::Token>_>)0x0;
        local_2d0._0_8_ = (long)local_2d0 + 0x10;
        sStack_f8._40_8_ = sStack_f8._32_8_;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2d0,*(long *)(p_Var17 + 1),
                   (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
        prop = (Property *)(p_Var17 + 2);
        warn = (string *)local_488;
        local_488._0_8_ = local_478;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
        anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                  ((ParseResult *)local_5b8,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_508,(string *)local_2d0,prop,warn,
                   (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&local_2b0);
        if ((undefined1 *)local_488._0_8_ != local_478) {
          operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
        }
        if (local_2d0._0_8_ != (long)local_2d0 + 0x10) {
          operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
        }
        if (local_5b8._0_4_ == TypeMismatch) {
          local_2f0._0_8_ = local_2e0;
          ::std::__cxx11::string::_M_construct<char*>
                    (local_2f0,*(long *)(p_Var17 + 1),
                     (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
          warn = (string *)local_488;
          local_488._0_8_ = local_478;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)warn,"inputs:varname","");
          (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                    ((ParseResult *)local_590,(_anonymous_namespace_ *)&local_508,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_2f0,(string *)prop,(Property *)warn,(string *)local_538,
                     in_stack_fffffffffffffa38);
          if ((undefined1 *)local_488._0_8_ != local_478) {
            operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
          }
          paVar4 = &local_568.field_2;
          if ((undefined8 *)local_2f0._0_8_ != local_2e0) {
            operator_delete((void *)local_2f0._0_8_,local_2e0[0] + 1);
          }
          if (local_590._0_4_ == Success) {
            iVar10 = 3;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_488,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_488,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"():",3);
            poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_488,0x1098);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
            local_528[0] = local_518;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_528,"Faied to parse inputs:varname: {}","");
            fmt::format<std::__cxx11::string>
                      (&local_568,(fmt *)local_528,(string *)(local_590 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_488,local_568._M_dataplus._M_p,
                                 local_568._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_568._M_dataplus._M_p != paVar4) {
              operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_528[0] != local_518) {
              operator_delete(local_528[0],local_518[0] + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar14 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)local_528,(ulong)(err->_M_dataplus)._M_p);
              psVar3 = (size_type *)(plVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar3) {
                local_568.field_2._M_allocated_capacity = *psVar3;
                local_568.field_2._8_8_ = plVar14[3];
                local_568._M_dataplus._M_p = (pointer)paVar4;
              }
              else {
                local_568.field_2._M_allocated_capacity = *psVar3;
                local_568._M_dataplus._M_p = (pointer)*plVar14;
              }
              local_568._M_string_length = plVar14[1];
              *plVar14 = (long)psVar3;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_568);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_568._M_dataplus._M_p != paVar4) {
                operator_delete(local_568._M_dataplus._M_p,
                                local_568.field_2._M_allocated_capacity + 1);
              }
              if (local_528[0] != local_518) {
                operator_delete(local_528[0],local_518[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
            ::std::ios_base::~ios_base(local_418);
            iVar10 = 1;
          }
          if ((undefined1 *)local_590._8_8_ != local_580 + 8) {
            operator_delete((void *)local_590._8_8_,local_580._8_8_ + 1);
          }
        }
        else {
          iVar10 = 0;
          if (local_5b8._0_4_ == Success) {
            bVar20 = ConvertTokenAttributeToStringAttribute
                               ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&local_2b0
                                ,local_538);
            iVar10 = 3;
            if (!bVar20) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"():",3);
              poVar12 = (ostream *)::std::ostream::operator<<((ostringstream *)local_488,0x1086);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,
                         "Failed to convert inputs:varname token type to string type.",0x3b);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"\n",1);
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar14 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_568,(ulong)(err->_M_dataplus)._M_p);
                pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (plVar14 + 2);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar14 ==
                    pbVar2) {
                  local_580._0_8_ = (pbVar2->_M_dataplus)._M_p;
                  local_580._8_8_ = plVar14[3];
                  local_590._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_580;
                }
                else {
                  local_580._0_8_ = (pbVar2->_M_dataplus)._M_p;
                  local_590._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar14
                  ;
                }
                local_590._8_8_ = plVar14[1];
                *plVar14 = (long)pbVar2;
                plVar14[1] = 0;
                *(undefined1 *)(plVar14 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_590);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_590._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580)
                {
                  operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_568._M_dataplus._M_p != &local_568.field_2) {
                  operator_delete(local_568._M_dataplus._M_p,
                                  local_568.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
              ::std::ios_base::~ios_base(local_418);
              iVar10 = 1;
            }
          }
        }
        if (local_5b0._M_p != local_5a8 + 8) {
          operator_delete(local_5b0._M_p,local_5a8._8_8_ + 1);
        }
        if (auStack_98[0x10] == '\x01') {
          nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
          destruct_value(local_80);
        }
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(local_c8 + 0x28));
        AttrMetas::~AttrMetas((AttrMetas *)&local_2b0);
        if (iVar10 == 0) goto LAB_002373d5;
LAB_00238ac4:
        if ((iVar10 != 3) && (iVar10 != 0)) {
          bVar20 = false;
          goto LAB_00238b3f;
        }
      }
      else {
LAB_002373d5:
        local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4d8,*(long *)(p_Var17 + 1),
                   (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
        local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_568,"inputs:fallback","")
        ;
        sVar6 = local_4d8._M_string_length;
        sVar5 = local_568._M_string_length;
        local_5b0._M_p = local_5a8 + 8;
        local_5a8._0_8_ = (char *)0x0;
        local_5a8._8_8_ = local_5a8._8_8_ & 0xffffffffffffff00;
        __n = local_4d8._M_string_length;
        if (local_568._M_string_length < local_4d8._M_string_length) {
          __n = local_568._M_string_length;
        }
        if (__n == 0) {
          if (local_4d8._M_string_length == local_568._M_string_length) goto LAB_0023747e;
LAB_002377da:
          local_5b8._0_4_ = 1;
        }
        else {
          iVar10 = bcmp(local_4d8._M_dataplus._M_p,local_568._M_dataplus._M_p,__n);
          if ((sVar6 != sVar5) || (iVar10 != 0)) goto LAB_002377da;
LAB_0023747e:
          if (((ulong)p_Var17[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
            local_5b8._0_4_ = 7;
            local_590._0_8_ = &DAT_0000003e;
            local_488._0_8_ = local_478;
            local_488._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_488,(ulong)local_590)
            ;
            local_478._0_8_ = local_590._0_8_;
            builtin_strncpy((char *)local_488._0_8_,
                            "Property `{}` must be Attribute, but declared as Relationship.",0x3e);
            local_488._8_8_ = local_590._0_8_;
            *(char *)(local_488._0_8_ + local_590._0_8_) = '\0';
            fmt::format<std::__cxx11::string>
                      ((string *)&local_2b0,(fmt *)local_488,&local_568,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_590._0_8_);
            ::std::__cxx11::string::operator=((string *)&local_5b0,(string *)&local_2b0);
            if ((undefined1 *)_local_2b0 != local_2a8 + 8) {
              operator_delete((void *)_local_2b0,
                              CONCAT17(local_2a8[0xf],
                                       CONCAT16(local_2a8[0xe],
                                                CONCAT24(local_2a8._12_2_,
                                                         CONCAT22(local_2a8._10_2_,local_2a8._8_2_))
                                               )) + 1);
            }
            if ((undefined1 *)local_488._0_8_ != local_478) {
              operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
            }
          }
          if (p_Var17[6]._M_left != p_Var17[6]._M_parent) {
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4a8,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var17[6]._M_parent);
            local_5b8 = (undefined1  [8])((ulong)local_5b8 & 0xffffffff00000000);
          }
          Attribute::type_name_abi_cxx11_((string *)local_590,(Attribute *)(p_Var17 + 2));
          _local_2b0 = local_2a8 + 8;
          local_2a8._12_2_ = 0x3274;
          local_2a8._8_2_ = 0x6c66;
          local_2a8._10_2_ = 0x616f;
          local_2a8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6
          ;
          local_2a8[0xe] = '\0';
          if ((pointer)local_590._8_8_ == (pointer)0x6) {
            uVar19 = (uint)(ushort)((ushort)*(uint *)(local_590._0_8_ + 4) ^ 0x3274) |
                     *(uint *)local_590._0_8_ ^ 0x616f6c66;
            var = (PrimVar *)(ulong)uVar19;
            if (uVar19 != 0) {
              local_488._8_8_ = (anon_struct_8_0_00000001_for___align)0x6;
              local_478._0_7_ = 0x3274616f6c66;
              uVar18 = (ushort)*(uint *)(local_590._0_8_ + 4) ^ 0x3274;
              var = (PrimVar *)(ulong)uVar18;
              local_488._0_8_ = local_478;
              if (uVar18 != 0 || *(uint *)local_590._0_8_ != 0x616f6c66) goto LAB_00237654;
            }
            iVar10 = *(int *)((long)&p_Var17[0x17]._M_parent + 4);
            if (iVar10 != 1) {
              if (iVar10 == 0) {
                (local_540->fallback)._value_empty = true;
                AttrMetas::operator=(local_548,(AttrMetas *)(p_Var17 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_508,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_568);
                local_5b8 = (undefined1  [8])((ulong)local_5b8 & 0xffffffff00000000);
              }
              else {
                warn = (string *)0x25;
                ::std::__cxx11::string::_M_replace
                          ((ulong)&local_5b0,0,(char *)local_5a8._0_8_,0x5d3f70);
                local_5b8._0_4_ = 8;
              }
              goto LAB_002377b3;
            }
            if (p_Var17[5]._M_left == p_Var17[5]._M_parent) {
              if (p_Var17[4]._M_right == (_Base_ptr)0x0) {
                bVar20 = false;
              }
              else {
                iVar10 = (**(code **)p_Var17[4]._M_right)();
                bVar20 = iVar10 == 4;
                var = extraout_RDX;
              }
              uVar8 = (undefined1)p_Var17[5]._M_color;
              if ((bVar20) || ((uVar8 & _S_black) != _S_red)) {
                (local_540->fallback)._blocked = true;
              }
            }
            else {
              uVar8 = (undefined1)p_Var17[5]._M_color;
            }
            if (((((uVar8 & _S_black) == _S_red) && (p_Var17[4]._M_right != (_Base_ptr)0x0)) &&
                ((iVar10 = (**(code **)p_Var17[4]._M_right)(), var = extraout_RDX_00, iVar10 == 0 ||
                 ((p_Var17[4]._M_right != (_Base_ptr)0x0 &&
                  (iVar10 = (**(code **)p_Var17[4]._M_right)(), var = extraout_RDX_01, iVar10 == 1))
                 )))) && (p_Var17[5]._M_left == p_Var17[5]._M_parent)) {
              if (p_Var17[6]._M_left != p_Var17[6]._M_parent) {
                AttrMetas::operator=(local_548,(AttrMetas *)(p_Var17 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_508,&local_4d8);
                local_5b8 = (undefined1  [8])((ulong)local_5b8 & 0xffffffff00000000);
              }
              goto LAB_002377b3;
            }
            (anonymous_namespace)::ConvertToAnimatable<std::array<float,2ul>>
                      ((optional<tinyusdz::Animatable<std::array<float,_2UL>_>_> *)local_488,
                       (_anonymous_namespace_ *)&p_Var17[4]._M_parent,var);
            fVar7 = local_488[0];
            local_2b0 = local_488[0];
            if (local_488[0] == (fmt)0x1) {
              local_2a8._8_2_ = local_478._0_2_;
              local_2a8._0_8_ = local_488._8_8_;
              local_298.data.__align = (anon_struct_8_0_00000001_for___align)local_478._8_8_;
              local_298._8_8_ = local_478._16_8_;
              local_298._16_8_ = local_478._24_8_;
              local_298._24_1_ = local_478[0x20];
              nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,2ul>>>::
              operator=(local_4b8,(Animatable<std::array<float,_2UL>_> *)local_2a8);
              fVar9 = local_2b0;
            }
            else {
              local_5b8._0_4_ = 8;
              warn = (string *)0x55;
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_5b0,0,(char *)local_5a8._0_8_,0x5d423e);
              fVar9 = fVar7;
            }
            if ((((byte)fVar9 & 1) != 0) &&
               (local_298.data.__align != (anon_struct_8_0_00000001_for___align)0x0)) {
              operator_delete((void *)local_298.data._0_8_,local_298._16_8_ - local_298._0_8_);
            }
            if (fVar7 != (fmt)0x0) {
              AttrMetas::operator=(local_548,(AttrMetas *)(p_Var17 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_508,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_568);
              local_5b8 = (undefined1  [8])((ulong)local_5b8 & 0xffffffff00000000);
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580)
            goto LAB_002377c2;
          }
          else {
LAB_00237654:
            local_5b8._0_4_ = 3;
            ::std::__cxx11::stringstream::stringstream((stringstream *)&local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_2a8 + 8),"Property type mismatch. ",0x18);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_2a8 + 8),local_568._M_dataplus._M_p,
                                 local_568._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," expects type `",0xf);
            local_488._0_8_ = local_478;
            local_488._8_8_ = (anon_struct_8_0_00000001_for___align)0x6;
            local_478._0_7_ = 0x3274616f6c66;
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,local_478,6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"` but defined as type `",0x17);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                (poVar12,(char *)local_590._0_8_,local_590._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"`",1);
            if ((undefined1 *)local_488._0_8_ != local_478) {
              operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
            }
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::operator=((string *)&local_5b0,(string *)local_488);
            if ((undefined1 *)local_488._0_8_ != local_478) {
              operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
            }
            ::std::__cxx11::stringstream::~stringstream((stringstream *)&local_2b0);
            ::std::ios_base::~ios_base(aiStack_230);
LAB_002377b3:
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580) {
LAB_002377c2:
              operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
          operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
        }
        iVar10 = 0;
        if (((ulong)local_5b8 & 0xfffffffd) == 0) {
          iVar10 = 3;
LAB_00237e43:
          bVar20 = false;
        }
        else {
          bVar20 = true;
          if (local_5b8._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"():",3);
            poVar12 = (ostream *)::std::ostream::operator<<((Property *)&local_2b0,0x109e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
            local_590._0_8_ = local_580;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_590,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[16],std::__cxx11::string>
                      ((string *)local_488,(fmt *)local_590,(string *)"inputs:fallback",
                       (char (*) [16])&local_5b0,warn);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_2b0,(char *)local_488._0_8_,local_488._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            if ((undefined1 *)local_488._0_8_ != local_478) {
              operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580) {
              operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              puVar13 = (undefined8 *)
                        ::std::__cxx11::string::_M_append(local_590,(ulong)(err->_M_dataplus)._M_p);
              pcVar1 = (char *)(puVar13 + 2);
              if ((char *)*puVar13 == pcVar1) {
                local_478._0_8_ = *(undefined8 *)pcVar1;
                local_478._8_8_ = puVar13[3];
                local_488._0_8_ = local_478;
              }
              else {
                local_478._0_8_ = *(undefined8 *)pcVar1;
                local_488._0_8_ = (char *)*puVar13;
              }
              local_488._8_8_ = *(anon_struct_8_0_00000001_for___align *)(puVar13 + 1);
              *puVar13 = pcVar1;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_488);
              if ((undefined1 *)local_488._0_8_ != local_478) {
                operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_590._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580) {
                operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b0);
            ::std::ios_base::~ios_base((ios_base *)(auStack_250 + 0x10));
            iVar10 = 1;
            goto LAB_00237e43;
          }
        }
        if (local_5b0._M_p != local_5a8 + 8) {
          operator_delete(local_5b0._M_p,local_5a8._8_8_ + 1);
        }
        if (!bVar20) goto LAB_00238ac4;
        local_310._0_8_ = local_300;
        ::std::__cxx11::string::_M_construct<char*>
                  (local_310,*(long *)(p_Var17 + 1),
                   (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
        _local_2b0 = local_2a8 + 8;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"outputs:result","");
        warn = (string *)&local_2b0;
        (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,2ul>>
                  ((ParseResult *)local_488,(_anonymous_namespace_ *)&local_508,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_310,(string *)(p_Var17 + 2),(Property *)&local_2b0,local_4a0,
                   (TypedTerminalAttribute<std::array<float,_2UL>_> *)in_stack_fffffffffffffa38);
        if ((undefined1 *)_local_2b0 != local_2a8 + 8) {
          operator_delete((void *)_local_2b0,
                          CONCAT17(local_2a8[0xf],
                                   CONCAT16(local_2a8[0xe],
                                            CONCAT24(local_2a8._12_2_,
                                                     CONCAT22(local_2a8._10_2_,local_2a8._8_2_)))) +
                          1);
        }
        if ((long *)local_310._0_8_ != local_300) {
          operator_delete((void *)local_310._0_8_,local_300[0] + 1);
        }
        iVar10 = 0;
        if ((local_488._0_8_ & 0xfffffffd) == 0) {
          iVar10 = 3;
LAB_002383fc:
          bVar20 = false;
        }
        else {
          bVar20 = true;
          if (local_488._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"():",3);
            poVar12 = (ostream *)::std::ostream::operator<<((Property *)&local_2b0,0x10a0);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
            local_590._0_8_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_590,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_5b8,(fmt *)local_590,(string *)0x5e0dce,
                       (char (*) [15])(local_488 + 8),warn);
            poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_2b0,(char *)local_5b8,(long)local_5b0._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
            if (local_5b8 != (undefined1  [8])local_5a8) {
              operator_delete((void *)local_5b8,(ulong)(local_5a8._0_8_ + 1));
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_590._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580) {
              operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar15 = (long *)::std::__cxx11::string::_M_append
                                          (local_590,(ulong)(err->_M_dataplus)._M_p);
              plVar14 = plVar15 + 2;
              if ((long *)*plVar15 == plVar14) {
                local_5a8._0_8_ = *plVar14;
                local_5a8._8_8_ = plVar15[3];
                local_5b8 = (undefined1  [8])local_5a8;
              }
              else {
                local_5a8._0_8_ = *plVar14;
                local_5b8 = (undefined1  [8])*plVar15;
              }
              local_5b0._M_p = (pointer)plVar15[1];
              *plVar15 = (long)plVar14;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_5b8);
              if (local_5b8 != (undefined1  [8])local_5a8) {
                operator_delete((void *)local_5b8,(ulong)(local_5a8._0_8_ + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_590._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580) {
                operator_delete((void *)local_590._0_8_,(ulong)(local_580._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b0);
            ::std::ios_base::~ios_base((ios_base *)(auStack_250 + 0x10));
            iVar10 = 1;
            goto LAB_002383fc;
          }
        }
        if (local_488._8_8_ != (long)local_478 + 8) {
          operator_delete((void *)local_488._8_8_,local_478._8_8_ + 1);
        }
        __k = local_490;
        if (!bVar20) goto LAB_00238ac4;
        cVar11 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_508,(key_type *)local_490);
        if ((_Rb_tree_header *)cVar11._M_node == &local_508._M_impl.super__Rb_tree_header) {
          pmVar16 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[](local_4b0,(key_type *)__k);
          ::std::__cxx11::string::_M_assign((string *)pmVar16);
          (pmVar16->_attrib)._varying_authored = (bool)p_Var17[3].field_0x4;
          (pmVar16->_attrib)._variability = p_Var17[3]._M_color;
          ::std::__cxx11::string::_M_assign((string *)&(pmVar16->_attrib)._type_name);
          linb::any::operator=((any *)&(pmVar16->_attrib)._var,(any *)&p_Var17[4]._M_parent);
          (pmVar16->_attrib)._var._blocked = SUB41(p_Var17[5]._M_color,0);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&(pmVar16->_attrib)._var._ts,
                      (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                       *)&p_Var17[5]._M_parent);
          (pmVar16->_attrib)._var._ts._dirty = SUB41(p_Var17[6]._M_color,0);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar16->_attrib)._paths,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var17[6]._M_parent);
          AttrMetas::operator=(&(pmVar16->_attrib)._metas,(AttrMetas *)(p_Var17 + 7));
          *(_Base_ptr *)&pmVar16->_listOpQual = p_Var17[0x17]._M_parent;
          (pmVar16->_rel).type = *(Type *)&p_Var17[0x17]._M_left;
          Path::operator=(&(pmVar16->_rel).targetPath,(Path *)&p_Var17[0x17]._M_right);
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    (&(pmVar16->_rel).targetPathVector,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var17[0x1e]._M_parent);
          (pmVar16->_rel).listOpQual = p_Var17[0x1f]._M_color;
          AttrMetas::operator=(&(pmVar16->_rel)._metas,(AttrMetas *)&p_Var17[0x1f]._M_parent);
          (pmVar16->_rel)._varying_authored = *(bool *)&p_Var17[0x2f]._M_left;
          ::std::__cxx11::string::_M_assign((string *)&pmVar16->_prop_value_type_name);
          pmVar16->_has_custom = *(bool *)&p_Var17[0x30]._M_right;
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_508,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
        }
        cVar11 = ::std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&local_508,(key_type *)__k);
        if ((_Rb_tree_header *)cVar11._M_node == &local_508._M_impl.super__Rb_tree_header) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"[warn]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b0,"():",3);
          poVar12 = (ostream *)::std::ostream::operator<<((Property *)&local_2b0,0x10a2);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12," ",1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_488,"Unsupported/unimplemented property: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k)
          ;
          poVar12 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_2b0,(char *)local_488._0_8_,local_488._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
          if ((undefined1 *)local_488._0_8_ != local_478) {
            operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
          }
          if (local_530 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar13 = (undefined8 *)
                      ::std::__cxx11::string::_M_append(local_5b8,(ulong)(err->_M_dataplus)._M_p);
            pcVar1 = (char *)(puVar13 + 2);
            if ((char *)*puVar13 == pcVar1) {
              local_478._0_8_ = *(undefined8 *)pcVar1;
              local_478._8_8_ = puVar13[3];
              local_488._0_8_ = local_478;
            }
            else {
              local_478._0_8_ = *(undefined8 *)pcVar1;
              local_488._0_8_ = (char *)*puVar13;
            }
            local_488._8_8_ = *(anon_struct_8_0_00000001_for___align *)(puVar13 + 1);
            *puVar13 = pcVar1;
            puVar13[1] = 0;
            *(undefined1 *)(puVar13 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)local_530,(string *)local_488);
            if ((undefined1 *)local_488._0_8_ != local_478) {
              operator_delete((void *)local_488._0_8_,(ulong)(local_478._0_8_ + 1));
            }
            if (local_5b8 != (undefined1  [8])local_5a8) {
              operator_delete((void *)local_5b8,(ulong)(local_5a8._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2b0);
          ::std::ios_base::~ios_base((ios_base *)(auStack_250 + 0x10));
        }
      }
      p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
    } while (p_Var17 != local_498);
    bVar20 = true;
  }
LAB_00238b3f:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_508,(_Link_type)local_508._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar20;
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_float2>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_float2 *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    DCOUT("Primreader_float2 prop = " << prop.first);
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_float2,
                   preader->fallback)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_float2, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_float2, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}